

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-cmp.cpp
# Opt level: O2

void arrays(void)

{
  rtosc_arg_val_t ra [16];
  rtosc_arg_val_t la [16];
  
  ra[0].type = 'a';
  la[0].type = 'a';
  rtosc_av_arr_type_set(la,'i');
  rtosc_av_arr_type_set(ra,'i');
  rtosc_av_arr_len_set(la,3);
  rtosc_av_arr_len_set(ra,3);
  ra[3].type = 'i';
  ra[2].type = 'i';
  ra[1].type = 'i';
  la[3].type = 'i';
  la[2].type = 'i';
  la[1].type = 'i';
  ra[1].val._0_4_ = 1;
  ra[2].val._0_4_ = 2;
  ra[3].val._0_4_ = ra[2].val._0_4_;
  la[1].val._0_4_ = ra[1].val._0_4_;
  la[2].val._0_4_ = ra[2].val._0_4_;
  la[3].val._0_4_ = 3;
  cmp_gt(la,ra,4,4,(rtosc_cmp_options *)0x0,"[1 2 3]","[1 2 2]",0xe2);
  rtosc_av_arr_len_set(ra,2);
  ra[3].val._0_4_ = 3;
  cmp_gt(la,ra,4,4,(rtosc_cmp_options *)0x0,"[1 2 3]","[1 2] 3",0xe7);
  return;
}

Assistant:

void arrays()
{
    // fill three arrays, both with the ints 1, 2, 3 resp. 1, 2, 2
    rtosc_arg_val_t la[16], ra[16]; // left array, right array
    la[0].type = ra[0].type = 'a';
    rtosc_av_arr_type_set(la, 'i');
    rtosc_av_arr_type_set(ra, 'i');
    rtosc_av_arr_len_set(la, 3);
    rtosc_av_arr_len_set(ra, 3);
    la[1].type = la[2].type = la[3].type =
    ra[1].type = ra[2].type = ra[3].type = 'i';
    la[1].val.i = 1; la[2].val.i = 2; la[3].val.i = 3;
    ra[1].val.i = 1; ra[2].val.i = 2; ra[3].val.i = 2;

    // same size
    cmp_gt(la, ra, 4, 4, NULL, "[1 2 3]", "[1 2 2]", __LINE__);

    // different size
    rtosc_av_arr_len_set(ra, 2);
    ra[3].val.i = 3;
    cmp_gt(la, ra, 4, 4, NULL, "[1 2 3]", "[1 2] 3", __LINE__);
}